

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time.cc
# Opt level: O2

ostream * absl::lts_20240722::time_internal::operator<<(ostream *os,CivilYear y)

{
  ostream *poVar1;
  undefined8 in_RCX;
  CivilYear c;
  string local_30;
  
  c.f_.y = y.f_._8_8_;
  c.f_._8_8_ = in_RCX;
  FormatCivilTime_abi_cxx11_(&local_30,(lts_20240722 *)y.f_.y,c);
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, CivilYear y) {
  return os << FormatCivilTime(y);
}